

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O0

void msd_CE5(uchar **strings,size_t n,size_t depth,uint16_t *oracle,uchar **sorted)

{
  uchar *puVar1;
  size_t sVar2;
  uint16_t uVar3;
  size_t *__ptr;
  ulong local_68;
  size_t i_4;
  size_t bsum;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t *bucketsize;
  size_t i;
  uchar **sorted_local;
  uint16_t *oracle_local;
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x10000) {
    msd_CE2_16bit_5(strings,n,depth,(uchar *)oracle,sorted);
  }
  else {
    for (bucketsize = (size_t *)0x0; bucketsize < n; bucketsize = (size_t *)((long)bucketsize + 1))
    {
      uVar3 = get_char<unsigned_short>(strings[(long)bucketsize],depth);
      oracle[(long)bucketsize] = uVar3;
    }
    __ptr = (size_t *)calloc(0x10000,8);
    for (i_2 = 0; i_2 < n; i_2 = i_2 + 1) {
      __ptr[oracle[i_2]] = __ptr[oracle[i_2]] + 1;
    }
    msd_CE5::bucketindex[0] = 0;
    for (i_3 = 1; i_3 < 0x10000; i_3 = i_3 + 1) {
      msd_CE5::bucketindex[i_3] = msd_CE5::bucketindex[i_3 - 1] + __ptr[i_3 - 1];
    }
    for (bsum = 0; bsum < n; bsum = bsum + 1) {
      puVar1 = strings[bsum];
      sVar2 = msd_CE5::bucketindex[oracle[bsum]];
      msd_CE5::bucketindex[oracle[bsum]] = sVar2 + 1;
      sorted[sVar2] = puVar1;
    }
    memcpy(strings,sorted,n << 3);
    i_4 = *__ptr;
    for (local_68 = 1; local_68 < 0x10000; local_68 = local_68 + 1) {
      if (__ptr[local_68] != 0) {
        if ((local_68 & 0xff) != 0) {
          msd_CE5(strings + i_4,__ptr[local_68],depth + 2,oracle,sorted);
        }
        i_4 = __ptr[local_68] + i_4;
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void
msd_CE5(unsigned char** strings, size_t n, size_t depth,
		uint16_t* oracle, unsigned char** sorted)
{
	if (n < 0x10000) {
		msd_CE2_16bit_5(strings, n, depth,
			(unsigned char*)oracle, sorted);
		return;
	}
	for (size_t i=0; i < n; ++i)
		oracle[i] = get_char<uint16_t>(strings[i], depth);
	size_t* restrict bucketsize = (size_t*)
		calloc(0x10000, sizeof(size_t));
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	static size_t bucketindex[0x10000];
	bucketindex[0] = 0;
	for (size_t i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_CE5(strings+bsum, bucketsize[i],
				depth+2, oracle, sorted);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}